

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O3

void __thiscall
optional_scalars::ScalarStuff::UnPackTo
          (ScalarStuff *this,ScalarStuffT *_o,resolver_function_t *_resolver)

{
  ushort uVar1;
  uint uVar2;
  uint32_t uVar3;
  long lVar4;
  ulong uVar5;
  unsigned_short vtsize;
  int16_t iVar6;
  ushort uVar7;
  uint uVar8;
  int32_t iVar9;
  ulong uVar10;
  _Storage<long,_true> _Var11;
  _Storage<unsigned_long,_true> _Var12;
  ScalarStuff SVar13;
  uint16_t uVar14;
  int64_t iVar15;
  uint64_t uVar16;
  bool bVar17;
  float fVar18;
  _Storage<double,_true> in_XMM0_Qa;
  double dVar19;
  undefined4 local_7;
  undefined3 uStack_3;
  
  uVar1 = *(ushort *)(this + -(long)*(int *)this);
  if (uVar1 < 5) {
    _o->just_i8 = '\0';
LAB_0017f815:
    uVar1 = 0;
    uVar7 = 0;
  }
  else {
    lVar4 = -(long)*(int *)this;
    if ((ulong)*(ushort *)(this + lVar4 + 4) == 0) {
      SVar13.super_Table = (Table)0x0;
    }
    else {
      SVar13.super_Table = this[*(ushort *)(this + lVar4 + 4)].super_Table;
    }
    _o->just_i8 = (int8_t)SVar13.super_Table;
    if ((uVar1 < 7) || ((ulong)*(ushort *)(this + lVar4 + 6) == 0)) goto LAB_0017f815;
    uVar1 = (ushort)(byte)this[*(ushort *)(this + lVar4 + 6)].super_Table;
    uVar7 = 0x100;
  }
  (_o->maybe_i8).super__Optional_base<signed_char,_true,_true>._M_payload.
  super__Optional_payload_base<signed_char> = (_Optional_payload_base<signed_char>)(uVar7 | uVar1);
  uVar1 = *(ushort *)(this + -(long)*(int *)this);
  if (uVar1 < 9) {
    _o->default_i8 = '*';
LAB_0017f870:
    _o->just_u8 = '\0';
LAB_0017f874:
    uVar1 = 0;
    uVar7 = 0;
  }
  else {
    lVar4 = -(long)*(int *)this;
    if ((ulong)*(ushort *)(this + lVar4 + 8) == 0) {
      SVar13.super_Table = (Table)0x2a;
    }
    else {
      SVar13.super_Table = this[*(ushort *)(this + lVar4 + 8)].super_Table;
    }
    _o->default_i8 = (int8_t)SVar13.super_Table;
    if (uVar1 < 0xb) goto LAB_0017f870;
    if ((ulong)*(ushort *)(this + lVar4 + 10) == 0) {
      SVar13.super_Table = (Table)0x0;
    }
    else {
      SVar13.super_Table = this[*(ushort *)(this + lVar4 + 10)].super_Table;
    }
    _o->just_u8 = (uint8_t)SVar13.super_Table;
    if ((uVar1 < 0xd) || ((ulong)*(ushort *)(this + lVar4 + 0xc) == 0)) goto LAB_0017f874;
    uVar1 = (ushort)(byte)this[*(ushort *)(this + lVar4 + 0xc)].super_Table;
    uVar7 = 0x100;
  }
  (_o->maybe_u8).super__Optional_base<unsigned_char,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_char> =
       (_Optional_payload_base<unsigned_char>)(uVar7 | uVar1);
  lVar4 = -(long)*(int *)this;
  uVar1 = *(ushort *)(this + -(long)*(int *)this);
  if (uVar1 < 0xf) {
    _o->default_u8 = '*';
LAB_0017f8c9:
    iVar6 = 0;
  }
  else {
    if ((ulong)*(ushort *)(this + lVar4 + 0xe) == 0) {
      SVar13.super_Table = (Table)0x2a;
    }
    else {
      SVar13.super_Table = this[*(ushort *)(this + lVar4 + 0xe)].super_Table;
    }
    _o->default_u8 = (uint8_t)SVar13.super_Table;
    if ((uVar1 < 0x11) || ((ulong)*(ushort *)(this + lVar4 + 0x10) == 0)) goto LAB_0017f8c9;
    iVar6 = *(int16_t *)(this + *(ushort *)(this + lVar4 + 0x10));
  }
  _o->just_i16 = iVar6;
  uVar8 = 0;
  if (*(ushort *)(this + lVar4) < 0x13) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    if ((ulong)*(ushort *)(this + lVar4 + 0x12) != 0) {
      uVar8 = (uint)*(ushort *)(this + *(ushort *)(this + lVar4 + 0x12));
      uVar2 = 0x10000;
    }
  }
  (_o->maybe_i16).super__Optional_base<short,_true,_true>._M_payload.
  super__Optional_payload_base<short> = (_Optional_payload_base<short>)(uVar8 | uVar2);
  lVar4 = -(long)*(int *)this;
  iVar6 = 0x2a;
  if ((0x14 < *(ushort *)(this + -(long)*(int *)this)) &&
     ((ulong)*(ushort *)(this + lVar4 + 0x14) != 0)) {
    iVar6 = *(int16_t *)(this + *(ushort *)(this + lVar4 + 0x14));
  }
  _o->default_i16 = iVar6;
  uVar8 = 0;
  uVar14 = 0;
  if (0x16 < *(ushort *)(this + lVar4)) {
    if ((ulong)*(ushort *)(this + lVar4 + 0x16) == 0) {
      uVar14 = 0;
    }
    else {
      uVar14 = *(uint16_t *)(this + *(ushort *)(this + lVar4 + 0x16));
    }
  }
  _o->just_u16 = uVar14;
  if (*(ushort *)(this + lVar4) < 0x19) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    if ((ulong)*(ushort *)(this + lVar4 + 0x18) != 0) {
      uVar8 = (uint)*(ushort *)(this + *(ushort *)(this + lVar4 + 0x18));
      uVar2 = 0x10000;
    }
  }
  (_o->maybe_u16).super__Optional_base<unsigned_short,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_short> =
       (_Optional_payload_base<unsigned_short>)(uVar8 | uVar2);
  lVar4 = -(long)*(int *)this;
  uVar14 = 0x2a;
  if ((0x1a < *(ushort *)(this + -(long)*(int *)this)) &&
     ((ulong)*(ushort *)(this + lVar4 + 0x1a) != 0)) {
    uVar14 = *(uint16_t *)(this + *(ushort *)(this + lVar4 + 0x1a));
  }
  _o->default_u16 = uVar14;
  iVar9 = 0;
  if ((0x1c < *(ushort *)(this + lVar4)) &&
     (iVar9 = 0, (ulong)*(ushort *)(this + lVar4 + 0x1c) != 0)) {
    iVar9 = *(int32_t *)(this + *(ushort *)(this + lVar4 + 0x1c));
  }
  _o->just_i32 = iVar9;
  if ((*(ushort *)(this + -(long)*(int *)this) < 0x1f) ||
     ((ulong)*(ushort *)(this + (0x1e - (long)*(int *)this)) == 0)) {
    uVar5 = 0;
    uVar10 = 0;
  }
  else {
    uVar10 = 0x100000000;
    uVar5 = (ulong)*(uint *)(this + *(ushort *)(this + (0x1e - (long)*(int *)this)));
  }
  (_o->maybe_i32).super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
       = (_Optional_payload_base<int>)(uVar5 | uVar10);
  iVar9 = 0x2a;
  if ((0x20 < *(ushort *)(this + -(long)*(int *)this)) &&
     ((ulong)*(ushort *)(this + (0x20 - (long)*(int *)this)) != 0)) {
    iVar9 = *(int32_t *)(this + *(ushort *)(this + (0x20 - (long)*(int *)this)));
  }
  _o->default_i32 = iVar9;
  uVar3 = 0;
  if ((0x22 < *(ushort *)(this + -(long)*(int *)this)) &&
     ((ulong)*(ushort *)(this + (0x22 - (long)*(int *)this)) != 0)) {
    uVar3 = *(uint32_t *)(this + *(ushort *)(this + (0x22 - (long)*(int *)this)));
  }
  _o->just_u32 = uVar3;
  if ((*(ushort *)(this + -(long)*(int *)this) < 0x25) ||
     ((ulong)*(ushort *)(this + (0x24 - (long)*(int *)this)) == 0)) {
    uVar5 = 0;
    uVar10 = 0;
  }
  else {
    uVar10 = 0x100000000;
    uVar5 = (ulong)*(uint *)(this + *(ushort *)(this + (0x24 - (long)*(int *)this)));
  }
  (_o->maybe_u32).super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_payload_base<unsigned_int>)(uVar5 | uVar10);
  uVar3 = 0x2a;
  if ((0x26 < *(ushort *)(this + -(long)*(int *)this)) &&
     ((ulong)*(ushort *)(this + (0x26 - (long)*(int *)this)) != 0)) {
    uVar3 = *(uint32_t *)(this + *(ushort *)(this + (0x26 - (long)*(int *)this)));
  }
  _o->default_u32 = uVar3;
  uVar1 = *(ushort *)(this + -(long)*(int *)this);
  _Var11._M_value._2_6_ = 0;
  _Var11._M_value._0_2_ = uVar1;
  if (uVar1 < 0x29) {
    _o->just_i64 = 0;
LAB_0017fad9:
    bVar17 = false;
  }
  else {
    lVar4 = -(long)*(int *)this;
    if ((ulong)*(ushort *)(this + lVar4 + 0x28) == 0) {
      iVar15 = 0;
    }
    else {
      iVar15 = *(int64_t *)(this + *(ushort *)(this + lVar4 + 0x28));
    }
    _o->just_i64 = iVar15;
    if ((uVar1 < 0x2b) || ((ulong)*(ushort *)(this + lVar4 + 0x2a) == 0)) goto LAB_0017fad9;
    _Var11 = *(_Storage<long,_true> *)(this + *(ushort *)(this + lVar4 + 0x2a));
    bVar17 = true;
  }
  (_o->maybe_i64).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload = _Var11;
  (_o->maybe_i64).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = bVar17;
  *(undefined4 *)
   &(_o->maybe_i64).super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>.field_0x9 = local_7;
  *(uint *)&(_o->maybe_i64).super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>.field_0xc = CONCAT31(uStack_3,local_7._3_1_);
  uVar1 = *(ushort *)(this + -(long)*(int *)this);
  _Var12._M_value._2_6_ = 0;
  _Var12._M_value._0_2_ = uVar1;
  if (uVar1 < 0x2d) {
    _o->default_i64 = 0x2a;
LAB_0017fb45:
    _o->just_u64 = 0;
LAB_0017fb4d:
    bVar17 = false;
  }
  else {
    lVar4 = -(long)*(int *)this;
    if ((ulong)*(ushort *)(this + lVar4 + 0x2c) == 0) {
      iVar15 = 0x2a;
    }
    else {
      iVar15 = *(int64_t *)(this + *(ushort *)(this + lVar4 + 0x2c));
    }
    _o->default_i64 = iVar15;
    if (uVar1 < 0x2f) goto LAB_0017fb45;
    if ((ulong)*(ushort *)(this + lVar4 + 0x2e) == 0) {
      uVar16 = 0;
    }
    else {
      uVar16 = *(uint64_t *)(this + *(ushort *)(this + lVar4 + 0x2e));
    }
    _o->just_u64 = uVar16;
    if ((uVar1 < 0x31) || ((ulong)*(ushort *)(this + lVar4 + 0x30) == 0)) goto LAB_0017fb4d;
    _Var12 = *(_Storage<unsigned_long,_true> *)(this + *(ushort *)(this + lVar4 + 0x30));
    bVar17 = true;
  }
  (_o->maybe_u64).super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload = _Var12;
  (_o->maybe_u64).super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = bVar17;
  *(undefined4 *)
   &(_o->maybe_u64).super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>.field_0x9 = local_7;
  *(uint *)&(_o->maybe_u64).super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>.field_0xc = CONCAT31(uStack_3,local_7._3_1_)
  ;
  uVar1 = *(ushort *)(this + -(long)*(int *)this);
  if (uVar1 < 0x33) {
    _o->default_u64 = 0x2a;
LAB_0017fbba:
    _o->just_f32 = 0.0;
LAB_0017fbc1:
    uVar5 = 0;
    uVar10 = 0;
  }
  else {
    lVar4 = -(long)*(int *)this;
    if ((ulong)*(ushort *)(this + lVar4 + 0x32) == 0) {
      uVar16 = 0x2a;
    }
    else {
      uVar16 = *(uint64_t *)(this + *(ushort *)(this + lVar4 + 0x32));
    }
    _o->default_u64 = uVar16;
    if (uVar1 < 0x35) goto LAB_0017fbba;
    if ((ulong)*(ushort *)(this + lVar4 + 0x34) == 0) {
      fVar18 = 0.0;
    }
    else {
      fVar18 = *(float *)(this + *(ushort *)(this + lVar4 + 0x34));
    }
    in_XMM0_Qa._4_4_ = 0;
    in_XMM0_Qa._0_4_ = fVar18;
    _o->just_f32 = fVar18;
    if ((uVar1 < 0x37) || ((ulong)*(ushort *)(this + lVar4 + 0x36) == 0)) goto LAB_0017fbc1;
    uVar10 = 0x100000000;
    uVar5 = (ulong)*(uint *)(this + *(ushort *)(this + lVar4 + 0x36));
  }
  (_o->maybe_f32).super__Optional_base<float,_true,_true>._M_payload.
  super__Optional_payload_base<float> = (_Optional_payload_base<float>)(uVar5 | uVar10);
  uVar1 = *(ushort *)(this + -(long)*(int *)this);
  if (uVar1 < 0x39) {
    _o->default_f32 = 42.0;
LAB_0017fc2c:
    _o->just_f64 = 0.0;
LAB_0017fc37:
    bVar17 = false;
  }
  else {
    lVar4 = -(long)*(int *)this;
    if ((ulong)*(ushort *)(this + lVar4 + 0x38) == 0) {
      fVar18 = 42.0;
    }
    else {
      fVar18 = *(float *)(this + *(ushort *)(this + lVar4 + 0x38));
    }
    in_XMM0_Qa._4_4_ = 0;
    in_XMM0_Qa._0_4_ = fVar18;
    _o->default_f32 = fVar18;
    if (uVar1 < 0x3b) goto LAB_0017fc2c;
    if ((ulong)*(ushort *)(this + lVar4 + 0x3a) == 0) {
      in_XMM0_Qa._M_value = 0.0;
    }
    else {
      in_XMM0_Qa = *(_Storage<double,_true> *)(this + *(ushort *)(this + lVar4 + 0x3a));
    }
    _o->just_f64 = (double)in_XMM0_Qa;
    if ((uVar1 < 0x3d) || ((ulong)*(ushort *)(this + lVar4 + 0x3c) == 0)) goto LAB_0017fc37;
    in_XMM0_Qa = *(_Storage<double,_true> *)(this + *(ushort *)(this + lVar4 + 0x3c));
    bVar17 = true;
  }
  (_o->maybe_f64).super__Optional_base<double,_true,_true>._M_payload.
  super__Optional_payload_base<double>._M_payload = in_XMM0_Qa;
  (_o->maybe_f64).super__Optional_base<double,_true,_true>._M_payload.
  super__Optional_payload_base<double>._M_engaged = bVar17;
  *(undefined4 *)
   &(_o->maybe_f64).super__Optional_base<double,_true,_true>._M_payload.
    super__Optional_payload_base<double>.field_0x9 = local_7;
  *(uint *)&(_o->maybe_f64).super__Optional_base<double,_true,_true>._M_payload.
            super__Optional_payload_base<double>.field_0xc = CONCAT31(uStack_3,local_7._3_1_);
  uVar1 = *(ushort *)(this + -(long)*(int *)this);
  if (uVar1 < 0x3f) {
    _o->default_f64 = 42.0;
LAB_0017fcc4:
    _o->just_bool = false;
LAB_0017fccb:
    uVar1 = 0;
    uVar7 = 0;
  }
  else {
    lVar4 = -(long)*(int *)this;
    if ((ulong)*(ushort *)(this + lVar4 + 0x3e) == 0) {
      dVar19 = 42.0;
    }
    else {
      dVar19 = *(double *)(this + *(ushort *)(this + lVar4 + 0x3e));
    }
    _o->default_f64 = dVar19;
    if (uVar1 < 0x41) goto LAB_0017fcc4;
    if ((ulong)*(ushort *)(this + lVar4 + 0x40) == 0) {
      bVar17 = false;
    }
    else {
      bVar17 = this[*(ushort *)(this + lVar4 + 0x40)].super_Table != (Table)0x0;
    }
    _o->just_bool = bVar17;
    if ((uVar1 < 0x43) || ((ulong)*(ushort *)(this + lVar4 + 0x42) == 0)) goto LAB_0017fccb;
    uVar1 = (ushort)(this[*(ushort *)(this + lVar4 + 0x42)].super_Table != (Table)0x0);
    uVar7 = 0x100;
  }
  (_o->maybe_bool).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)(uVar7 | uVar1);
  uVar1 = *(ushort *)(this + -(long)*(int *)this);
  if (uVar1 < 0x45) {
    _o->default_bool = true;
LAB_0017fd33:
    _o->just_enum = OptionalByte_MIN;
  }
  else {
    lVar4 = -(long)*(int *)this;
    if ((ulong)*(ushort *)(this + lVar4 + 0x44) == 0) {
      bVar17 = true;
    }
    else {
      bVar17 = this[*(ushort *)(this + lVar4 + 0x44)].super_Table != (Table)0x0;
    }
    _o->default_bool = bVar17;
    if (uVar1 < 0x47) goto LAB_0017fd33;
    if ((ulong)*(ushort *)(this + lVar4 + 0x46) == 0) {
      SVar13.super_Table = (Table)0x0;
    }
    else {
      SVar13.super_Table = this[*(ushort *)(this + lVar4 + 0x46)].super_Table;
    }
    _o->just_enum = (OptionalByte)SVar13.super_Table;
    if ((0x48 < uVar1) && ((ulong)*(ushort *)(this + lVar4 + 0x48) != 0)) {
      uVar1 = (ushort)(byte)this[*(ushort *)(this + lVar4 + 0x48)].super_Table;
      uVar7 = 0x100;
      goto LAB_0017fd3e;
    }
  }
  uVar1 = 0;
  uVar7 = 0;
LAB_0017fd3e:
  (_o->maybe_enum).super__Optional_base<optional_scalars::OptionalByte,_true,_true>._M_payload.
  super__Optional_payload_base<optional_scalars::OptionalByte> =
       (_Optional_payload_base<optional_scalars::OptionalByte>)(uVar7 | uVar1);
  SVar13.super_Table = (Table)0x1;
  if ((0x4a < *(ushort *)(this + -(long)*(int *)this)) &&
     ((ulong)*(ushort *)(this + (0x4a - (long)*(int *)this)) != 0)) {
    SVar13.super_Table = this[*(ushort *)(this + (0x4a - (long)*(int *)this))].super_Table;
  }
  _o->default_enum = (OptionalByte)SVar13.super_Table;
  return;
}

Assistant:

T ReadScalar(const void *p) {
  return EndianScalar(*reinterpret_cast<const T *>(p));
}